

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmBitFieldDn<(moira::Instr)135,(moira::Mode)8,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  u32 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  char cVar9;
  byte bVar10;
  Dn dn;
  uint uVar11;
  Ea<(moira::Mode)8,_4> result;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar2 = (*this->_vptr_Moira[6])();
  uVar11 = uVar2 & 0xffff;
  if ((0xfff < uVar11) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)135,(moira::Mode)8,4>(this,str,addr,op);
    return;
  }
  local_40 = op & 7;
  uVar3 = uVar11 >> 6;
  uVar4 = uVar3 & 0x1f;
  s = &str->ptr;
  cVar9 = 'b';
  lVar7 = 1;
  do {
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = cVar9;
    cVar9 = "bfclr"[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = ' ';
  }
  else {
    iVar5 = (str->tab).raw;
    pcVar8 = str->ptr;
    do {
      str->ptr = pcVar8 + 1;
      *pcVar8 = ' ';
      pcVar8 = str->ptr;
    } while (pcVar8 < str->base + iVar5);
  }
  local_44 = *addr;
  *addr = local_44 + 2;
  iVar5 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  uVar6 = (*this->_vptr_Moira[6])(this);
  local_3c = uVar6 & 0xffff | iVar5 << 0x10;
  StrWriter::operator<<(str,(Ea<(moira::Mode)8,_4> *)&local_44);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    uVar11 = uVar2 & 0x820;
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = ',';
    if (uVar11 < 0x800) {
      if (uVar11 != 0) {
        sprintd_signed(s,(ulong)uVar4);
LAB_003c36cd:
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ',';
        StrWriter::operator<<(str,(Dn)(uVar2 & 7));
        goto LAB_003c3748;
      }
      sprintd_signed(s,(ulong)uVar4);
      pcVar8 = *s;
      *s = pcVar8 + 1;
    }
    else {
      if (uVar11 != 0x800) {
        StrWriter::operator<<(str,(Dn)(uVar3 & 7));
        goto LAB_003c36cd;
      }
      StrWriter::operator<<(str,(Dn)(uVar3 & 7));
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
    }
    *pcVar8 = ',';
    sprintd_signed(s,(ulong)(uVar2 & 0x1f));
    goto LAB_003c3748;
  }
  bVar10 = 0x20;
  if ((uVar2 & 0x1f) != 0) {
    bVar10 = (byte)uVar11 & 0x1f;
  }
  uVar2 = uVar2 & 0x820;
  if (uVar2 < 0x800) {
    if (uVar2 != 0) {
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ' ';
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = '{';
      sprintd_signed(s,(ulong)uVar4);
LAB_003c371a:
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ':';
      dn.raw._1_3_ = 0;
      dn.raw._0_1_ = bVar10 & 7;
      StrWriter::operator<<(str,dn);
      goto LAB_003c3739;
    }
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = ' ';
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = '{';
    sprintd_signed(s,(ulong)uVar4);
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = ':';
    sprintd_signed(s,(ulong)bVar10);
    pcVar8 = *s;
    *s = pcVar8 + 1;
  }
  else {
    if (uVar2 != 0x800) {
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ' ';
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = '{';
      StrWriter::operator<<(str,(Dn)(uVar3 & 7));
      goto LAB_003c371a;
    }
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = ' ';
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = '{';
    StrWriter::operator<<(str,(Dn)(uVar3 & 7));
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = ':';
    sprintd_signed(s,(ulong)bVar10);
LAB_003c3739:
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
  }
  *pcVar8 = '}';
LAB_003c3748:
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar9 = ';';
    lVar7 = 1;
    do {
      pcVar8 = *s;
      *s = pcVar8 + 1;
      *pcVar8 = cVar9;
      cVar9 = "trap%-2s  ; (2+)"[lVar7 + 10];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmBitFieldDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word>(addr);
    auto dst = _____________xxx(op);
    auto o   = _____xxxxx______(ext);
    auto w   = ___________xxxxx(ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;

    if constexpr (I == Instr::BFINS) {
        str << Dn ( _xxx____________(ext) ) << Sep{};
    }

    str << Op<M, S>(dst, addr);

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (ext & 0x0820) {

                case 0x0000: str << "," << o << "," << w; break;
                case 0x0020: str << "," << o << "," << Dn{w&7}; break;
                case 0x0800: str << "," << Dn{o&7} << "," << w; break;
                case 0x0820: str << "," << Dn{o&7} << "," << Dn{w&7}; break;
            }
            break;

        default:

            if (w == 0) w = 32;

            switch (ext & 0x0820) {

                case 0x0000: str << " {" << o << ":" << w << "}"; break;
                case 0x0020: str << " {" << o << ":" << Dn{w&7} << "}"; break;
                case 0x0800: str << " {" << Dn{o&7} << ":" << w << "}"; break;
                case 0x0820: str << " {" << Dn{o&7} << ":" << Dn{w&7} << "}"; break;
            }
    }

    if constexpr (I == Instr::BFEXTU || I == Instr::BFEXTS || I == Instr::BFFFO) {
        str << Sep{} << Dn ( _xxx____________(ext) );
    }
    str << Av<I, M, S>{};
}